

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_exg_dd(m68k_info *info)

{
  build_r(info,0x52,'\x04');
  return;
}

Assistant:

static void d68000_exg_dd(m68k_info *info)
{
	build_r(info, M68K_INS_EXG, 4);
}